

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::texparameterf(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ContextType CVar3;
  GLuint texture;
  string local_38;
  GLuint local_14;
  
  local_14 = 0x1234;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&local_14);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,local_14);
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target or pname is not one of the accepted defined values."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0,0x2801,9729.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0,9729.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0,0,9729.0);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x90ea,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x884c,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x884d,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x2800,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x2801,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x8e42,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x8e43,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x8e44,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x8e45,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x2802,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x2803,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x8072,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x813c,-1.0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x813d,-1.0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  CVar3.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(CVar3,(ApiType)0x23);
  if (bVar2) {
    local_38._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "GL_INVALID_ENUM is generated if pname is a non-scalar parameter.","");
    NegativeTestContext::beginSection(ctx,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0xde1,0x1004,0.0);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x1004,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x2801,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x2800,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x2802,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x2803,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x8072,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x813a,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x813b,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x884c,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x884d,-1.0);
  NegativeTestContext::expectError(ctx,0x500);
  CVar3.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(CVar3,(ApiType)0x23);
  if (bVar2) {
LAB_0058ec81:
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x1004,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x2801,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x2800,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x2802,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x2803,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x8072,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x813a,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x813b,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x884c,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x884d,-1.0);
    NegativeTestContext::expectError(ctx,0x500);
  }
  else {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (ctx->m_ctxInfo,"GL_OES_texture_storage_multisample_2d_array");
    if (bVar2) goto LAB_0058ec81;
  }
  NegativeTestContext::endSection(ctx);
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9100,0x813c,1.0);
  NegativeTestContext::expectError(ctx,0x502);
  CVar3.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(CVar3,(ApiType)0x23);
  if (!bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (ctx->m_ctxInfo,"GL_OES_texture_storage_multisample_2d_array");
    if (!bVar2) goto LAB_0058eec5;
  }
  glu::CallLogWrapper::glTexParameterf(&ctx->super_CallLogWrapper,0x9102,0x813c,1.0);
  NegativeTestContext::expectError(ctx,0x502);
LAB_0058eec5:
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&local_14);
  return;
}

Assistant:

void texparameterf (NegativeTestContext& ctx)
{
	GLuint texture = 0x1234;
	GLfloat textureMode = -1.0f;
	ctx.glGenTextures(1, &texture);
	ctx.glBindTexture(GL_TEXTURE_2D, texture);

	ctx.beginSection("GL_INVALID_ENUM is generated if target or pname is not one of the accepted defined values.");
	ctx.glTexParameterf(0, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, 0, GL_LINEAR);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(0, 0, GL_LINEAR);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value.");
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_G, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_B, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_A, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_WRAP_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative.");
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, -1.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, -1.0f);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		ctx.beginSection("GL_INVALID_ENUM is generated if pname is a non-scalar parameter.");
		ctx.glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_BORDER_COLOR, 0.0f);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.endSection();
	}

	ctx.beginSection("GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid.");
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BORDER_COLOR, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAG_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_S, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_T, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAX_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_FUNC, textureMode);
	ctx.expectError(GL_INVALID_ENUM);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
	{
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BORDER_COLOR, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_FILTER, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAG_FILTER, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_S, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_T, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_R, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_LOD, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAX_LOD, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_MODE, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_FUNC, textureMode);
		ctx.expectError(GL_INVALID_ENUM);
	}
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0.");
	ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BASE_LEVEL, 1.0f);
	ctx.expectError(GL_INVALID_OPERATION);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
	{
		ctx.glTexParameterf(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BASE_LEVEL, 1.0f);
		ctx.expectError(GL_INVALID_OPERATION);
	}
	ctx.endSection();

	ctx.glDeleteTextures(1, &texture);
}